

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerImpl::SignRequest
          (Error *__return_storage_ptr__,CommissionerImpl *this,Request *aRequest,Scope aScope,
          bool aAppendToken)

{
  string *this_00;
  ErrorCode EVar1;
  int iVar2;
  ByteArray signature;
  ByteArray local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  Tlv local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_80 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_80;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
  if ((char)iVar2 == '\0') {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp"
                  ,0x5a0,
                  "Error ot::commissioner::CommissionerImpl::SignRequest(coap::Request &, tlv::Scope, bool)"
                 );
  }
  TokenManager::SignMessage((Error *)local_58,&this->mTokenManager,&local_98,aRequest);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    if (aAppendToken) {
      tlv::Tlv::Tlv(&local_78,kCommissionerToken,&(this->mTokenManager).mSignedToken,aScope);
      AppendTlv((Error *)local_58,aRequest,&local_78);
      __return_storage_ptr__->mCode = local_58._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
      EVar1 = __return_storage_ptr__->mCode;
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      if (local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (EVar1 != kNone) goto LAB_0015c048;
    }
    tlv::Tlv::Tlv(&local_78,kCommissionerSignature,&local_98,aScope);
    AppendTlv((Error *)local_58,aRequest,&local_78);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_0015c048:
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::SignRequest(coap::Request &aRequest, tlv::Scope aScope, bool aAppendToken)
{
    Error     error;
    ByteArray signature;

    ASSERT(IsCcmMode());

    SuccessOrExit(error = mTokenManager.SignMessage(signature, aRequest));

    if (aAppendToken)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerToken, mTokenManager.GetToken(), aScope}));
    }
    SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kCommissionerSignature, signature, aScope}));

exit:
    return error;
}